

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3813::T0DetJElementCenterForEAS
          (ChElementHexaANCF_3813 *this,ChMatrixNM<double,_8,_3> *d0,ChMatrixNM<double,_6,_6> *T0,
          double *detJ0C)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double dVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  double dVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  double dVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  double dVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  ChMatrixNM<double,_3,_3> j0;
  ChMatrixNM<double,_3,_3> rd0;
  assign_op<double,_double> local_139;
  double local_138;
  undefined8 uStack_130;
  double local_128;
  undefined8 uStack_120;
  double local_118;
  undefined8 uStack_110;
  double local_108;
  undefined8 uStack_100;
  double local_f8;
  undefined8 uStack_f0;
  double local_e8;
  undefined8 uStack_e0;
  double local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  SrcXprType local_a8;
  Matrix<double,_3,_3,_1,_3,_3> local_a0;
  undefined1 local_58 [16];
  double local_48;
  undefined8 uStack_40;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  double local_18;
  
  dVar37 = (d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
           [0];
  dVar41 = (d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
           [1];
  auVar5 = vmovddup_avx512vl(ZEXT816(0x8000000000000000));
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array[8];
  auVar6 = vmovddup_avx512vl(auVar26);
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
       [0xb];
  auVar7 = vmovddup_avx512vl(auVar25);
  auVar26 = *(undefined1 (*) [16])
             ((d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
              array + 3);
  dVar33 = (d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
           [5];
  auVar69._8_8_ = dVar33;
  auVar69._0_8_ = dVar33;
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       (d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
       [0x11];
  auVar8 = vmovddup_avx512vl(auVar27);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data
                 .array[0xe];
  auVar9 = vmovddup_avx512vl(auVar2);
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array[2];
  auVar10 = vmovddup_avx512vl(auVar28);
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
       [0x14];
  auVar11 = vmovddup_avx512vl(auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
       [0x17];
  auVar12 = vmovddup_avx512vl(auVar23);
  auVar25 = *(undefined1 (*) [16])
             ((d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
              array + 6);
  auVar27 = *(undefined1 (*) [16])
             ((d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
              array + 9);
  auVar2 = *(undefined1 (*) [16])
            ((d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
             array + 0xc);
  auVar28 = *(undefined1 (*) [16])
             ((d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
              array + 0xf);
  auVar22 = *(undefined1 (*) [16])
             ((d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
              array + 0x12);
  auVar23 = *(undefined1 (*) [16])
             ((d0->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
              array + 0x15);
  local_a8.m_xpr = (XprTypeNested)local_58;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = (this->m_InertFlexVec).m_data[2];
  auVar13 = vdivsd_avx512f(ZEXT816(0x4000000000000000),auVar18);
  auVar15._8_8_ = 0x4000000000000000;
  auVar15._0_8_ = 0x4000000000000000;
  auVar18 = vdivpd_avx(auVar15,*(undefined1 (*) [16])(this->m_InertFlexVec).m_data);
  auVar21._8_8_ = 0x3fc0000000000000;
  auVar21._0_8_ = 0x3fc0000000000000;
  auVar14 = vmulpd_avx512vl(auVar18,auVar21);
  dVar51 = auVar14._0_8_;
  auVar34._8_8_ = dVar51;
  auVar34._0_8_ = dVar51;
  auVar18 = vshufpd_avx(auVar14,auVar14,1);
  auVar15 = vmulpd_avx512vl(auVar14,auVar6);
  auVar16 = vmulpd_avx512vl(auVar14,auVar7);
  auVar24 = vshufpd_avx(auVar14,auVar14,3);
  auVar17 = vmulpd_avx512vl(auVar14,auVar10);
  auVar18 = vxorpd_avx512vl(auVar18,auVar5);
  auVar20._0_8_ = dVar37 * dVar51;
  auVar20._8_8_ = dVar41 * dVar51;
  auVar21 = vunpcklpd_avx(auVar14,auVar18);
  auVar19 = vmulpd_avx512vl(auVar21,auVar69);
  auVar18 = vaddsubpd_avx(auVar15,auVar16);
  auVar15 = vmulpd_avx512vl(auVar21,auVar8);
  auVar16 = vmulpd_avx512vl(auVar14,auVar9);
  auVar21 = vfmsub231pd_fma(auVar20,auVar26,auVar34);
  auVar15 = vsubpd_avx(auVar15,auVar16);
  auVar16 = vmulpd_avx512vl(auVar14,auVar11);
  auVar20 = vmulpd_avx512vl(auVar14,auVar12);
  auVar17 = vsubpd_avx512vl(auVar19,auVar17);
  auVar14 = vfmadd231pd_fma(auVar21,auVar25,auVar34);
  auVar21 = vaddsubpd_avx(auVar16,auVar20);
  auVar16 = vaddpd_avx512vl(auVar17,auVar18);
  auVar18 = vfnmadd231pd_fma(auVar14,auVar27,auVar34);
  local_28._0_8_ = auVar15._0_8_ + auVar21._0_8_ + auVar16._0_8_;
  local_28._8_8_ = auVar15._8_8_ + auVar21._8_8_ + auVar16._8_8_;
  auVar14 = vmulsd_avx512f(auVar13,ZEXT816(0x3fc0000000000000));
  auVar18 = vfnmadd231pd_fma(auVar18,auVar2,auVar34);
  auVar18 = vfmadd231pd_fma(auVar18,auVar28,auVar34);
  auVar18 = vfmadd231pd_fma(auVar18,auVar22,auVar34);
  dVar51 = auVar14._0_8_;
  auVar67._8_8_ = dVar51;
  auVar67._0_8_ = dVar51;
  auVar18 = vfnmadd231pd_fma(auVar18,auVar23,auVar34);
  auVar13._0_8_ = dVar37 * auVar24._0_8_;
  auVar13._8_8_ = dVar41 * auVar24._8_8_;
  auVar65._0_8_ = dVar51 * dVar37;
  auVar65._8_8_ = dVar51 * dVar41;
  auVar21 = vfnmsub231pd_fma(auVar13,auVar26,auVar24);
  auVar15 = vfnmsub231pd_fma(auVar65,auVar67,auVar26);
  auVar26 = vfmadd231pd_fma(auVar21,auVar25,auVar24);
  auVar25 = vfnmadd231pd_fma(auVar15,auVar67,auVar25);
  auVar26 = vfmadd231pd_fma(auVar26,auVar27,auVar24);
  auVar25 = vfnmadd231pd_fma(auVar25,auVar67,auVar27);
  auVar27 = vfnmadd231pd_fma(auVar26,auVar2,auVar24);
  auVar26 = vfmadd231pd_fma(auVar25,auVar67,auVar2);
  auVar21 = vmulsd_avx512f(auVar14,auVar12);
  auVar25 = vfnmadd231pd_fma(auVar27,auVar28,auVar24);
  auVar26 = vfmadd231pd_fma(auVar26,auVar67,auVar28);
  auVar15 = vmulsd_avx512f(auVar14,auVar10);
  auVar25 = vfmadd231pd_fma(auVar25,auVar22,auVar24);
  auVar26 = vfmadd231pd_fma(auVar26,auVar67,auVar22);
  auVar28 = vfmadd231pd_fma(auVar25,auVar23,auVar24);
  auVar2 = vfmadd231pd_fma(auVar26,auVar67,auVar23);
  local_58 = vunpcklpd_avx(auVar18,auVar28);
  local_38 = vunpckhpd_avx(auVar28,auVar2);
  auVar26 = vshufpd_avx(auVar28,auVar28,1);
  auVar22 = vxorpd_avx512vl(auVar67,auVar5);
  auVar25 = vshufpd_avx(auVar18,auVar18,1);
  auVar23 = vmulsd_avx512f(auVar7,auVar22);
  auVar24 = vmulsd_avx512f(auVar14,auVar6);
  auVar5 = vmulsd_avx512f(auVar14,auVar8);
  auVar6 = vmulsd_avx512f(auVar14,auVar9);
  auVar14 = vmulsd_avx512f(auVar14,auVar11);
  auVar27 = vshufpd_avx(local_28,local_28,1);
  local_18 = (dVar33 * auVar22._0_8_ - auVar15._0_8_) + (auVar23._0_8_ - auVar24._0_8_) +
             auVar6._0_8_ + auVar5._0_8_ + auVar14._0_8_ + auVar21._0_8_;
  uStack_40 = auVar18._8_8_;
  local_48 = auVar2._0_8_;
  auVar2 = vshufpd_avx(auVar2,auVar2,1);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_18;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = local_28._0_8_ * auVar2._0_8_;
  auVar22 = vfmsub231sd_fma(auVar38,auVar25,auVar10);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = auVar27._0_8_ * auVar2._0_8_;
  auVar2 = vfmsub231sd_fma(auVar48,auVar26,auVar10);
  dVar33 = auVar18._0_8_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = local_28._0_8_ * auVar26._0_8_;
  auVar23 = vfmsub231sd_fma(auVar39,auVar25,auVar27);
  *detJ0C = local_48 * auVar23._0_8_ + (dVar33 * auVar2._0_8_ - auVar28._0_8_ * auVar22._0_8_);
  dVar37 = auVar25._0_8_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar37 * dVar37;
  auVar25 = vfmadd231sd_fma(auVar42,auVar18,auVar18);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = auVar27._0_8_ * dVar33;
  auVar27 = vfmsub231sd_fma(auVar11,local_28,auVar28);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = auVar28._0_8_ * dVar37;
  auVar2 = vfmsub231sd_fma(auVar6,auVar18,auVar26);
  auVar26 = vfmadd231sd_fma(auVar25,local_28,local_28);
  local_d8 = auVar27._0_8_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = local_d8 * local_d8;
  auVar25 = vfmadd231sd_fma(auVar49,auVar23,auVar23);
  auVar26 = vsqrtsd_avx(auVar26,auVar26);
  auVar25 = vfmadd231sd_fma(auVar25,auVar2,auVar2);
  dVar41 = 1.0 / auVar26._0_8_;
  dVar33 = dVar33 * dVar41;
  dVar37 = dVar37 * dVar41;
  dVar41 = local_28._0_8_ * dVar41;
  auVar26 = vsqrtsd_avx(auVar25,auVar25);
  dVar46 = 1.0 / auVar26._0_8_;
  dVar51 = auVar23._0_8_ * dVar46;
  dVar54 = auVar2._0_8_ * dVar46;
  local_d8 = local_d8 * dVar46;
  local_c8._8_8_ = 0;
  local_c8._0_8_ = dVar51;
  local_b8._8_8_ = 0;
  local_b8._0_8_ = dVar54;
  uStack_d0 = 0;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar37 * dVar54;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_d8;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar41;
  auVar26 = vfmsub231sd_fma(auVar7,auVar12,auVar43);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar33;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar41 * dVar51;
  auVar25 = vfmsub231sd_fma(auVar60,local_b8,auVar14);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar37;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar33 * local_d8;
  auVar27 = vfmsub231sd_fma(auVar57,local_c8,auVar17);
  local_f8 = dVar33 + auVar26._0_8_ * 0.0;
  uStack_f0 = 0;
  local_128 = auVar25._0_8_ * 0.0 + dVar37;
  local_118 = auVar26._0_8_ - dVar33 * 0.0;
  uStack_120 = 0;
  local_e8 = auVar27._0_8_ * 0.0 + dVar41;
  uStack_110 = 0;
  local_138 = auVar25._0_8_ - dVar37 * 0.0;
  uStack_130 = 0;
  local_108 = auVar27._0_8_ - dVar41 * 0.0;
  uStack_e0 = 0;
  uStack_100 = 0;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(&local_a0,&local_a8,&local_139);
  auVar32 = _DAT_00997f80;
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       local_a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [7];
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       local_a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar44._8_8_ = local_138;
  auVar44._0_8_ = local_138;
  auVar47._8_8_ = local_128;
  auVar47._0_8_ = local_128;
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       local_a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [6];
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       local_a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [0];
  auVar62._8_8_ = local_118;
  auVar62._0_8_ = local_118;
  auVar66._8_8_ = local_f8;
  auVar66._0_8_ = local_f8;
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       local_a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [8];
  auVar58._8_8_ = 0;
  auVar58._0_8_ =
       local_a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar68._8_8_ = local_108;
  auVar68._0_8_ = local_108;
  auVar70._8_8_ = local_e8;
  auVar70._0_8_ = local_e8;
  auVar24._8_8_ = uStack_d0;
  auVar24._0_8_ = local_d8;
  auVar61._8_8_ = 0;
  auVar61._0_8_ =
       local_a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar26 = vunpcklpd_avx(auVar19,auVar55);
  auVar25 = vunpcklpd_avx(auVar47,auVar44);
  auVar27 = vunpcklpd_avx(auVar16,auVar52);
  auVar71._8_8_ = 0;
  auVar71._0_8_ =
       local_a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar18 = vunpcklpd_avx512vl(auVar55,auVar71);
  auVar5._0_8_ = auVar25._0_8_ * auVar26._0_8_;
  auVar5._8_8_ = auVar25._8_8_ * auVar26._8_8_;
  auVar26 = vunpcklpd_avx(auVar66,auVar62);
  auVar27 = vfmadd213pd_fma(auVar27,auVar26,auVar5);
  auVar26 = vunpcklpd_avx(auVar40,auVar58);
  auVar25 = vunpcklpd_avx(auVar70,auVar68);
  auVar72._8_8_ = 0;
  auVar72._0_8_ =
       local_a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [5];
  auVar15 = vunpcklpd_avx512vl(auVar58,auVar72);
  auVar22 = vfmadd213pd_fma(auVar26,auVar25,auVar27);
  auVar25 = vmulsd_avx512f(auVar24,auVar19);
  auVar26 = vunpcklpd_avx512vl(auVar71,auVar19);
  auVar35._0_8_ = local_138 * auVar26._0_8_;
  auVar35._8_8_ = local_138 * auVar26._8_8_;
  auVar26 = vunpcklpd_avx(auVar61,auVar16);
  auVar27 = vfmadd231sd_avx512f(auVar25,local_c8,auVar16);
  auVar28 = vunpcklpd_avx512vl(auVar72,auVar40);
  auVar26 = vfmadd213pd_fma(auVar26,auVar62,auVar35);
  auVar36._0_8_ = auVar18._0_8_ * local_128;
  auVar36._8_8_ = auVar18._8_8_ * local_128;
  auVar2 = vunpcklpd_avx(auVar52,auVar61);
  auVar14 = vaddsd_avx512f(auVar22,auVar22);
  auVar25 = vfmadd231pd_fma(auVar36,auVar2,auVar66);
  auVar5 = vfmadd231sd_avx512f(auVar27,local_b8,auVar40);
  auVar29 = vbroadcasti64x4_avx512f(_DAT_009986a0);
  auVar23 = vfmadd213pd_fma(auVar28,auVar68,auVar26);
  auVar21 = vfmadd231pd_fma(auVar25,auVar15,auVar70);
  auVar25 = vmulsd_avx512f(auVar5,auVar14);
  auVar26 = vshufpd_avx(auVar22,auVar23,1);
  auVar3 = vpermpd_avx2(ZEXT1632(auVar23),0x54);
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1b] =
       auVar25._0_8_;
  auVar25 = vshufpd_avx(auVar22,auVar22,1);
  dVar37 = auVar21._0_8_ + auVar21._0_8_;
  dVar41 = auVar21._8_8_ + auVar21._8_8_;
  auVar27 = vshufpd_avx(auVar21,auVar21,1);
  auVar6 = vmulsd_avx512f(auVar25,auVar22);
  auVar29 = vpermi2pd_avx512f(auVar29,ZEXT1664(auVar21),ZEXT1664(auVar22));
  dVar33 = auVar26._0_8_;
  dVar46 = auVar26._8_8_;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = auVar27._0_8_ * auVar25._0_8_;
  auVar28 = vfmadd231sd_fma(auVar63,auVar21,auVar23);
  auVar30 = vpermi2pd_avx512f(auVar32,auVar29,ZEXT1664(auVar23));
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xc] =
       dVar33 * dVar37;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xd] =
       dVar46 * dVar41;
  auVar24 = vmovddup_avx512vl(auVar24);
  auVar53._0_8_ = auVar24._0_8_ * auVar18._0_8_;
  auVar53._8_8_ = auVar24._8_8_ * auVar18._8_8_;
  auVar18 = vmovddup_avx512vl(local_c8);
  auVar2 = vfmadd213pd_fma(auVar18,auVar2,auVar53);
  auVar18 = vmovddup_avx512vl(local_b8);
  auVar18 = vfmadd213pd_fma(auVar18,auVar15,auVar2);
  dVar51 = auVar18._0_8_;
  auVar2 = vshufpd_avx(auVar18,auVar18,1);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar51 * auVar27._0_8_;
  auVar24 = vfmadd231sd_fma(auVar59,auVar21,auVar2);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = auVar25._0_8_ * auVar2._0_8_;
  auVar15 = vfmadd231sd_fma(auVar56,auVar18,auVar23);
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1a] =
       auVar24._0_8_;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1e] =
       dVar51 * (dVar33 + dVar33);
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1f] =
       auVar18._8_8_ * (dVar46 + dVar46);
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xe] =
       auVar28._0_8_;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x20] =
       auVar15._0_8_;
  auVar28 = vshufpd_avx(auVar23,auVar23,1);
  auVar24 = vmulsd_avx512f(auVar28,auVar14);
  dVar54 = auVar28._0_8_;
  auVar15 = vfmadd231sd_avx512f(auVar6,auVar21,auVar28);
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xf] =
       auVar24._0_8_;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = dVar51 * dVar54;
  auVar25 = vfmadd231sd_fma(auVar64,auVar5,auVar25);
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x21] =
       (dVar54 + dVar54) * auVar5._0_8_;
  auVar32 = _DAT_00997fc0;
  pdVar1 = (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array
           + 0x10;
  vmovsd_avx512f(auVar15);
  *pdVar1 = *pdVar1;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x22] =
       auVar25._0_8_;
  auVar4 = _DAT_00998080;
  auVar29 = _DAT_00998040;
  auVar31 = vpermpd_avx512f(_DAT_00998000,auVar30);
  auVar32 = vpermpd_avx512f(auVar32,auVar30);
  auVar32 = vmulpd_avx512f(auVar32,auVar31);
  *(undefined1 (*) [64])
   (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array =
       auVar32;
  auVar25 = vunpckhpd_avx(auVar22,auVar23);
  auVar50._16_16_ = auVar26;
  auVar50._0_16_ = auVar25;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[8] =
       auVar25._0_8_ * auVar3._0_8_;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[9] =
       auVar25._8_8_ * auVar3._8_8_;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[10] =
       dVar33 * auVar3._16_8_;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xb] =
       dVar46 * auVar3._24_8_;
  dVar33 = auVar22._0_8_;
  auVar8._0_8_ = dVar51 * dVar33;
  auVar8._8_8_ = auVar18._8_8_ * dVar33;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = auVar23._0_8_ * dVar33;
  auVar26 = vfmadd231sd_fma(auVar45,auVar28,auVar27);
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x11] =
       auVar26._0_8_;
  auVar32 = vbroadcastsd_avx512f(auVar5);
  auVar30 = vblendmpd_avx512f(ZEXT1664(auVar18),auVar32);
  auVar30 = ZEXT3264(CONCAT824(auVar30._24_8_,auVar50._0_24_));
  auVar26 = vfmadd213pd_fma(auVar32._0_16_,auVar21,auVar8);
  auVar32 = vpermpd_avx512f(auVar29,auVar30);
  auVar29 = vpermi2pd_avx512f(auVar4,auVar30,ZEXT1664(CONCAT88(dVar41,dVar37)));
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar54 * auVar2._0_8_;
  auVar25 = vfmadd231sd_fma(auVar9,auVar5,auVar23);
  auVar32 = vmulpd_avx512f(auVar32,auVar29);
  *(undefined1 (*) [64])
   ((T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array + 0x12
   ) = auVar32;
  *(undefined1 (*) [16])
   ((T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array + 0x1c
   ) = auVar26;
  (T0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x23] =
       auVar25._0_8_;
  return;
}

Assistant:

void ChElementHexaANCF_3813::T0DetJElementCenterForEAS(ChMatrixNM<double, 8, 3>& d0,
                                                       ChMatrixNM<double, 6, 6>& T0,
                                                       double& detJ0C) {
    ShapeVector Nx;
    ShapeVector Ny;
    ShapeVector Nz;
    ShapeFunctionsDerivativeX(Nx, 0, 0, 0);
    ShapeFunctionsDerivativeY(Ny, 0, 0, 0);
    ShapeFunctionsDerivativeZ(Nz, 0, 0, 0);

    ChMatrixNM<double, 3, 3> rd0;
    rd0.col(0) = d0.transpose() * Nx.transpose();
    rd0.col(1) = d0.transpose() * Ny.transpose();
    rd0.col(2) = d0.transpose() * Nz.transpose();
    detJ0C = rd0.determinant();

    // Transformation : Orthogonal transformation (A and J) ////
    ChVector<double> G1;
    ChVector<double> G2;
    ChVector<double> G3;
    ChVector<double> G1xG2;
    G1[0] = rd0(0, 0);
    G2[0] = rd0(0, 1);
    G3[0] = rd0(0, 2);
    G1[1] = rd0(1, 0);
    G2[1] = rd0(1, 1);
    G3[1] = rd0(1, 2);
    G1[2] = rd0(2, 0);
    G2[2] = rd0(2, 1);
    G3[2] = rd0(2, 2);
    G1xG2.Cross(G1, G2);

    // Tangent Frame
    ChVector<> A1 = G1 / sqrt(G1[0] * G1[0] + G1[1] * G1[1] + G1[2] * G1[2]);
    ChVector<> A3 = G1xG2 / sqrt(G1xG2[0] * G1xG2[0] + G1xG2[1] * G1xG2[1] + G1xG2[2] * G1xG2[2]);
    ChVector<> A2 = A3.Cross(A1);
    double theta = 0.0;
    ChVector<> AA1 = A1 * cos(theta) + A2 * sin(theta);
    ChVector<> AA2 = -A1 * sin(theta) + A2 * cos(theta);
    ChVector<> AA3 = A3;

    // Beta
    ChMatrixNM<double, 3, 3> j0 = rd0.inverse();
    ChVector<double> j01;
    ChVector<double> j02;
    ChVector<double> j03;
    j01[0] = j0(0, 0);
    j02[0] = j0(1, 0);
    j03[0] = j0(2, 0);
    j01[1] = j0(0, 1);
    j02[1] = j0(1, 1);
    j03[1] = j0(2, 1);
    j01[2] = j0(0, 2);
    j02[2] = j0(1, 2);
    j03[2] = j0(2, 2);
    ChVectorN<double, 9> beta;
    beta(0) = Vdot(AA1, j01);
    beta(1) = Vdot(AA2, j01);
    beta(2) = Vdot(AA3, j01);
    beta(3) = Vdot(AA1, j02);
    beta(4) = Vdot(AA2, j02);
    beta(5) = Vdot(AA3, j02);
    beta(6) = Vdot(AA1, j03);
    beta(7) = Vdot(AA2, j03);
    beta(8) = Vdot(AA3, j03);

    T0(0, 0) = pow(beta(0), 2);
    T0(1, 0) = pow(beta(1), 2);
    T0(2, 0) = 2.0 * beta(0) * beta(1);
    T0(3, 0) = pow(beta(2), 2);
    T0(4, 0) = 2.0 * beta(0) * beta(2);
    T0(5, 0) = 2.0 * beta(1) * beta(2);

    T0(0, 1) = pow(beta(3), 2);
    T0(1, 1) = pow(beta(4), 2);
    T0(2, 1) = 2.0 * beta(3) * beta(4);
    T0(3, 1) = pow(beta(5), 2);
    T0(4, 1) = 2.0 * beta(3) * beta(5);
    T0(5, 1) = 2.0 * beta(4) * beta(5);

    T0(0, 2) = beta(0) * beta(3);
    T0(1, 2) = beta(1) * beta(4);
    T0(2, 2) = beta(0) * beta(4) + beta(1) * beta(3);
    T0(3, 2) = beta(2) * beta(5);
    T0(4, 2) = beta(0) * beta(5) + beta(2) * beta(3);
    T0(5, 2) = beta(2) * beta(4) + beta(1) * beta(5);

    T0(0, 3) = pow(beta(6), 2);
    T0(1, 3) = pow(beta(7), 2);
    T0(2, 3) = 2.0 * beta(6) * beta(7);
    T0(3, 3) = pow(beta(8), 2);
    T0(4, 3) = 2.0 * beta(6) * beta(8);
    T0(5, 3) = 2.0 * beta(7) * beta(8);

    T0(0, 4) = beta(0) * beta(6);
    T0(1, 4) = beta(1) * beta(7);
    T0(2, 4) = beta(0) * beta(7) + beta(6) * beta(1);
    T0(3, 4) = beta(2) * beta(8);
    T0(4, 4) = beta(0) * beta(8) + beta(2) * beta(6);
    T0(5, 4) = beta(1) * beta(8) + beta(2) * beta(7);

    T0(0, 5) = beta(3) * beta(6);
    T0(1, 5) = beta(4) * beta(7);
    T0(2, 5) = beta(3) * beta(7) + beta(4) * beta(6);
    T0(3, 5) = beta(5) * beta(8);
    T0(4, 5) = beta(3) * beta(8) + beta(6) * beta(5);
    T0(5, 5) = beta(4) * beta(8) + beta(5) * beta(7);
}